

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall Liby::Socket::listen(Socket *this,int __fd,int __n)

{
  int iVar1;
  int extraout_EAX;
  int reuse;
  sockaddr_in address;
  
  if ((this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    createSocket(this);
  }
  setNoblock(this,true);
  reuse = 1;
  iVar1 = setsockopt(this->fd_,1,2,&reuse,4);
  if (-1 < iVar1) {
    address.sin_family = 2;
    address.sin_addr.s_addr = (this->ep_).addr_;
    address.sin_port = (this->ep_).port_;
    iVar1 = bind(this->fd_,(sockaddr *)&address,0x10);
    if (-1 < iVar1) {
      if (this->isUdp_ == false) {
        iVar1 = ::listen(this->fd_,0x14);
        if (iVar1 < 0) goto LAB_001078ef;
      }
      return iVar1;
    }
  }
LAB_001078ef:
  throw_err();
  return extraout_EAX;
}

Assistant:

void Socket::listen() {
    if (!fp_) {
        createSocket();
    }

    setNoblock();

    int reuse = 1;
    if (::setsockopt(fd_, SOL_SOCKET, SO_REUSEADDR, &reuse, sizeof(int)) < 0) {
        throw_err();
    }

    struct sockaddr_in address;
    address.sin_family = AF_INET;
    //    address.sin_len = sizeof(address);
    struct in_addr in_addr1;
    in_addr1.s_addr = ep_.addr_;
    address.sin_addr = in_addr1;
    address.sin_port = ep_.port_;

    if (::bind(fd_, (struct sockaddr *)&address, sizeof(address)) < 0) {
        throw_err();
    }
    if (isUdp_ == false && ::listen(fd_, 20) < 0) {
        throw_err();
    }
}